

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiIO *pIVar2;
  GLFWwindowfocusfun p_Var3;
  GLFWcursorenterfun p_Var4;
  GLFWcursorposfun p_Var5;
  GLFWmousebuttonfun p_Var6;
  GLFWscrollfun p_Var7;
  GLFWkeyfun p_Var8;
  GLFWcharfun p_Var9;
  GLFWmonitorfun p_Var10;
  void *pvVar11;
  
  pIVar1 = ImGui::GetCurrentContext();
  if (pIVar1 == (ImGuiContext *)0x0) {
    pvVar11 = (void *)0x0;
  }
  else {
    pIVar2 = ImGui::GetIO();
    pvVar11 = pIVar2->BackendPlatformUserData;
  }
  p_Var3 = glfwSetWindowFocusCallback(window,ImGui_ImplGlfw_WindowFocusCallback);
  *(GLFWwindowfocusfun *)((long)pvVar11 + 0x78) = p_Var3;
  p_Var4 = glfwSetCursorEnterCallback(window,ImGui_ImplGlfw_CursorEnterCallback);
  *(GLFWcursorenterfun *)((long)pvVar11 + 0x88) = p_Var4;
  p_Var5 = glfwSetCursorPosCallback(window,ImGui_ImplGlfw_CursorPosCallback);
  *(GLFWcursorposfun *)((long)pvVar11 + 0x80) = p_Var5;
  p_Var6 = glfwSetMouseButtonCallback(window,ImGui_ImplGlfw_MouseButtonCallback);
  *(GLFWmousebuttonfun *)((long)pvVar11 + 0x90) = p_Var6;
  p_Var7 = glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
  *(GLFWscrollfun *)((long)pvVar11 + 0x98) = p_Var7;
  p_Var8 = glfwSetKeyCallback(window,ImGui_ImplGlfw_KeyCallback);
  *(GLFWkeyfun *)((long)pvVar11 + 0xa0) = p_Var8;
  p_Var9 = glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
  *(GLFWcharfun *)((long)pvVar11 + 0xa8) = p_Var9;
  p_Var10 = glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
  *(GLFWmonitorfun *)((long)pvVar11 + 0xb0) = p_Var10;
  *(undefined1 *)((long)pvVar11 + 0x70) = 1;
  return;
}

Assistant:

void ImGui_ImplGlfw_InstallCallbacks(GLFWwindow* window)
{
    ImGui_ImplGlfw_Data* bd = ImGui_ImplGlfw_GetBackendData();
    IM_ASSERT(bd->InstalledCallbacks == false && "Callbacks already installed!");
    IM_ASSERT(bd->Window == window);

    bd->PrevUserCallbackWindowFocus = glfwSetWindowFocusCallback(window, ImGui_ImplGlfw_WindowFocusCallback);
    bd->PrevUserCallbackCursorEnter = glfwSetCursorEnterCallback(window, ImGui_ImplGlfw_CursorEnterCallback);
    bd->PrevUserCallbackCursorPos = glfwSetCursorPosCallback(window, ImGui_ImplGlfw_CursorPosCallback);
    bd->PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
    bd->PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
    bd->PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
    bd->PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    bd->PrevUserCallbackMonitor = glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
    bd->InstalledCallbacks = true;
}